

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableMultiplicationGeneralizationImpl.hpp
# Opt level: O3

Result Inferences::VariableMultiplicationGeneralizationImpl::applyRule
                 (Clause *cl,bool doOrderingCheck)

{
  char *pcVar1;
  undefined6 uVar2;
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
  *this;
  RawWithDefaultImpls<Kernel::MonomFactor<Kernel::NumTraits<IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<RealConstantType>_>_>
  *pRVar3;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  *pDVar4;
  undefined1 uVar5;
  VariableRegion *pVVar6;
  AnyNumber<Kernel::MonomFactor> *pAVar7;
  SplitSet *pSVar8;
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>,Inferences::__8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_>
  FVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined2 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  int iVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  ulong uVar22;
  undefined1 *puVar23;
  undefined7 uVar25;
  long lVar24;
  undefined4 uVar26;
  Clause *cl_00;
  size_t sVar27;
  Clause *extraout_RDX;
  Clause *cl_01;
  int *piVar28;
  uint uVar29;
  undefined7 in_register_00000031;
  undefined8 uVar30;
  byte bVar31;
  byte *pbVar32;
  void **head;
  RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top> *pRVar33;
  anon_class_16_2_d708292f f;
  Result RVar34;
  EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize> eval;
  Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> varRegions;
  AnyNumber<Kernel::MonomFactor> varPower;
  IntMap<Kernel::Variable> varMap;
  IntUnionFind components;
  Elem poly;
  uint local_368;
  char local_364;
  uint local_360;
  char local_35c;
  char local_358;
  undefined1 uStack_357;
  undefined6 uStack_356;
  char local_350;
  char local_348;
  undefined7 uStack_347;
  char local_340;
  Clause *local_338;
  Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> local_330;
  undefined4 local_30c;
  undefined1 local_308 [8];
  AnyNumber<Kernel::MonomFactor> *pAStack_300;
  SplitSet *local_2f8;
  SplitSet *pSStack_2f0;
  undefined1 local_2e8 [32];
  OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> local_2c8;
  OptionBase<Kernel::PolyNf::SubtermIter> local_2a0;
  undefined1 local_260 [8];
  Option<Kernel::AnyPoly> OStack_258;
  undefined1 local_240 [24];
  Value VStack_228;
  OptionBase<Kernel::PolyNf::SubtermIter> local_218;
  OptionBase<Kernel::Variable> local_1f0;
  byte *local_1e8;
  undefined1 local_1e0 [36];
  Value local_1bc;
  OptionBase<Kernel::PolyNf::SubtermIter> local_198;
  bool local_170;
  Value local_16c;
  Map<Kernel::Variable,_unsigned_int,_Lib::StlHash> local_168;
  long local_148;
  undefined8 *puStack_140;
  long local_138;
  undefined8 uStack_130;
  IntUnionFind local_128;
  ulong uStack_f0;
  OptionBase<Kernel::PolyNf::SubtermIter> local_e8;
  undefined1 local_c0 [32];
  int *piStack_a0;
  bool local_98;
  Value local_90;
  OptionBase<Kernel::PolyNf::SubtermIter> local_80;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_30c = (undefined4)CONCAT71(in_register_00000031,doOrderingCheck);
  local_168._capacity = 0;
  local_168._noOfEntries = 0;
  local_168._entries = (Entry *)0x0;
  Lib::Map<Kernel::Variable,_unsigned_int,_Lib::StlHash>::expand(&local_168);
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  puStack_140 = (undefined8 *)0x0;
  uVar21 = local_c0;
  uVar30 = cl;
  uVar20 = Inferences::anon_class_1_0_00000001::operator()
                     ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>_>
                       *)uVar21,(anon_class_1_0_00000001 *)cl,cl_00);
  uVar17 = local_80._elem._elem.init._stack._end;
  uVar16 = local_80._elem._elem.init._stack._stack;
  uVar15 = local_80._elem._elem.init._stack._capacity;
  local_128._parents = (int *)CONCAT44(local_c0._12_4_,CONCAT31(local_c0._9_3_,local_c0[8]));
  local_128._components._capacity = local_c0._24_8_;
  local_128._components._stack = piStack_a0;
  local_128._components._cursor._0_1_ = local_98;
  if (local_98 == true) {
    local_128._components._end = (int *)local_90.init._iter._lit;
    uStack_f0 = local_90._8_8_;
  }
  local_e8._isSome = local_80._isSome;
  if (local_80._isSome == true) {
    local_e8._elem._elem.init._stack._capacity = local_80._elem._elem.init._stack._capacity;
    local_80._elem._elem.init._stack._capacity = 0;
    local_e8._elem._elem.init._stack._cursor = local_80._elem._elem.init._stack._cursor;
    local_e8._elem._elem.init._stack._end = local_80._elem._elem.init._stack._end;
    local_80._elem._elem.init._stack._end = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    local_e8._elem._elem.init._stack._stack = local_80._elem._elem.init._stack._stack;
    local_80._elem._elem.init._stack._stack = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    local_80._elem._elem.init._stack._cursor = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    uVar20 = uVar16;
    uVar30 = uVar15;
    uVar21 = uVar17;
  }
  local_240._0_8_ = local_c0._24_8_;
  local_240._8_8_ = piStack_a0;
  OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[3] = local_c0[8];
  OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[4] = (char)local_c0._9_3_;
  OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[5] = SUB31(local_c0._9_3_,1);
  OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._7_2_ =
       (undefined2)(CONCAT44(local_c0._12_4_,CONCAT31(local_c0._9_3_,local_c0[8])) >> 0x18);
  OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[8] = SUB41(local_c0._12_4_,1);
  OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._10_2_ = SUB42(local_c0._12_4_,2);
  OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[0xb] = (char)local_c0._16_4_;
  OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._13_4_ =
       (undefined4)(CONCAT44(local_c0._20_4_,local_c0._16_4_) >> 8);
  OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._17_3_ = SUB43(local_c0._20_4_,1);
  local_240[0x10] = local_98;
  if (local_98 != false) {
    VStack_228.init._iter._lit = (Literal *)local_128._components._end;
    VStack_228._8_8_ = uStack_f0;
  }
  local_218._isSome = local_80._isSome;
  if (local_80._isSome != false) {
    local_e8._elem._elem.init._stack._capacity = 0;
    local_e8._elem._elem.init._stack._end = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    local_e8._elem._elem.init._stack._stack = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    local_e8._elem._elem.init._stack._cursor = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    local_218._elem._elem.init._stack._capacity = uVar30;
    local_218._elem._elem.init._stack._stack = (BottomUpChildIter<Kernel::PolyNf> *)uVar20;
    local_218._elem._elem.init._stack._end = (BottomUpChildIter<Kernel::PolyNf> *)uVar21;
  }
  local_1f0._isSome = false;
  local_1f0._1_3_ = 0;
  local_1f0._elem._elem = (Value)0x0;
  Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::Literal*)#1},Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1},Kernel::PolyNf::SubtermIter>>,Inferences::$_8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1}>
  ::operator()((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>,Inferences::__8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_>
                *)local_2e8,
               (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
                *)local_260);
  Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::Literal*)#1},Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1},Kernel::PolyNf::SubtermIter>>,Inferences::$_8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1}>
  ::operator()((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>,Inferences::__8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_>
                *)local_1e0,
               (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
                *)local_2e8);
  Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_2a0);
  Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_218);
  Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_e8);
  Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_80);
  bVar18 = Lib::
           FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>
           ::hasNext((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
                      *)local_1e0);
  if (bVar18) {
    Lib::
    FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>
    ::hasNext((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
               *)local_1e0);
    while( true ) {
      local_170 = false;
      local_2e8[0] = local_16c._0_1_;
      local_2e8[1] = local_16c._1_1_;
      local_2e8[2] = local_16c._2_1_;
      local_2e8[3] = local_16c._3_1_;
      Lib::Map<Kernel::Variable,unsigned_int,Lib::StlHash>::
      updateOrInit<Lib::Map<Kernel::Variable,unsigned_int,Lib::StlHash>::getOrInit<Inferences::VariableMultiplicationGeneralizationImpl::IntMap<Kernel::Variable>::insert(Kernel::Variable)::_lambda()_1_>(Kernel::Variable,Inferences::VariableMultiplicationGeneralizationImpl::IntMap<Kernel::Variable>::insert(Kernel::Variable)::_lambda()_1_)::_lambda(unsigned_int)_1_,Inferences::VariableMultiplicationGeneralizationImpl::IntMap<Kernel::Variable>::insert(Kernel::Variable)::_lambda()_1_>
                ((Map<Kernel::Variable,unsigned_int,Lib::StlHash> *)&local_168,local_16c.field2,
                 &local_168,local_2e8);
      bVar18 = Lib::
               FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>
               ::hasNext((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
                          *)local_1e0);
      if (!bVar18) break;
      Lib::
      FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>
      ::hasNext((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
                 *)local_1e0);
    }
  }
  Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_198);
  iVar19 = (int)((ulong)(local_138 - (long)puStack_140) >> 2);
  local_338 = cl;
  if (iVar19 == 0) {
    uVar26 = 0;
  }
  else {
    Lib::IntUnionFind::IntUnionFind(&local_128,iVar19);
    uVar22 = local_138 - (long)puStack_140;
    local_330._capacity = uVar22 >> 2 & 0xffffffff;
    if (local_330._capacity == 0) {
      local_330._stack = (VariableRegion *)0x0;
      sVar27 = 0;
    }
    else {
      uVar22 = local_330._capacity * 0x24 + 0xf & 0x7ffffffff0;
      if (uVar22 == 0) {
        local_330._stack =
             (VariableRegion *)
             Lib::FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
      }
      else if (uVar22 < 0x11) {
        local_330._stack =
             (VariableRegion *)
             Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      }
      else if (uVar22 < 0x19) {
        local_330._stack =
             (VariableRegion *)
             Lib::FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
      }
      else if (uVar22 < 0x21) {
        local_330._stack =
             (VariableRegion *)
             Lib::FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      }
      else if (uVar22 < 0x31) {
        local_330._stack =
             (VariableRegion *)
             Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
      }
      else if (uVar22 < 0x41) {
        local_330._stack =
             (VariableRegion *)
             Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
      }
      else {
        local_330._stack = (VariableRegion *)::operator_new(uVar22,0x10);
      }
      uVar22 = local_138 - (long)puStack_140;
      sVar27 = local_330._capacity;
    }
    cl_01 = (Clause *)(sVar27 * 9);
    local_330._end = (VariableRegion *)((long)local_330._stack + sVar27 * 0x24);
    puVar23 = (undefined1 *)(uVar22 >> 2);
    local_330._cursor = local_330._stack;
    if ((int)puVar23 != 0) {
      uVar29 = 0;
      do {
        uStack_50 = 0;
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        local_58 = 1;
        if (local_330._cursor == local_330._end) {
          Lib::Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion>::expand
                    (&local_330);
        }
        Lib::CoproductImpl::TrivialOperations::MoveCons::
        DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
        ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                       *)local_330._cursor,
                      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                       *)&local_58);
        local_330._cursor = (VariableRegion *)((long)local_330._cursor + 0x24);
        Lib::CoproductImpl::
        RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>::
        switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>>::~DefaultImpl()::_lambda(auto:1)_1_>
                  ((RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>
                    *)&local_58,(anon_class_8_1_8991fb9c)&local_58);
        uVar29 = uVar29 + 1;
        cl_01 = extraout_RDX;
      } while (uVar29 < (uint)((ulong)(local_138 - (long)puStack_140) >> 2));
    }
    Inferences::anon_class_1_0_00000001::operator()
              ((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
                *)local_2e8,(anon_class_1_0_00000001 *)cl,cl_01);
    local_260[0] = (byte)(IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
                          *)local_2e8;
    local_260[1] = (byte)((ulong)local_2e8 >> 8);
    local_260._2_4_ = (undefined4)((ulong)local_2e8 >> 0x10);
    local_260[6] = (char)((ulong)local_2e8 >> 0x30);
    local_260[7] = (char)((ulong)local_2e8 >> 0x38);
    Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
    ::tryNext(&OStack_258,
              (IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
               *)local_2e8);
    if ((OStack_258.super_OptionBase<Kernel::AnyPoly>._isSome & 1U) != 0) {
      this = (IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
              *)CONCAT17(local_260[7],
                         CONCAT16(local_260[6],
                                  CONCAT42(local_260._2_4_,CONCAT11(local_260[1],local_260[0]))));
      uVar25 = (undefined7)((ulong)puVar23 >> 8);
      uVar21 = CONCAT44(OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._13_4_,
                        CONCAT13(OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.
                                 super_AnyPolySuper._inner.
                                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
                                 .
                                 super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                                 ._content[0xb],
                                 CONCAT21(OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.
                                          _10_2_,OStack_258.super_OptionBase<Kernel::AnyPoly>._elem.
                                                 _elem.init.super_AnyPolySuper._inner.
                                                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
                                                 .
                                                 super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                                                 ._content[8])));
      local_c0._2_2_ = OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._2_2_;
      local_c0[1] = OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper
                    ._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                    ._content[0];
      local_c0[4] = OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper
                    ._inner.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
                    .
                    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                    ._content[3];
      local_1e0[4] = OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._0_1_;
      while( true ) {
        puVar23 = (undefined1 *)(CONCAT71(uVar25,local_1e0[4]) & 0xffffffffffffff03);
        local_c0._5_4_ = 0;
        local_c0[0] = SUB81(puVar23,0);
        local_c0._9_3_ = (undefined3)uVar21;
        local_c0._12_4_ = (undefined4)((ulong)uVar21 >> 0x18);
        local_c0[0x10] = (undefined1)((ulong)uVar21 >> 0x38);
        local_c0._17_3_ = 0;
        local_1e0._0_8_ = &local_128;
        local_1e0[8] = (char)&local_168;
        local_1e0._9_4_ = (undefined4)((ulong)&local_168 >> 8);
        local_1e0._13_3_ = (undefined3)((ulong)&local_168 >> 0x28);
        local_1e0._16_5_ = SUB85(&local_330,0);
        local_1e0._21_3_ = (undefined3)((ulong)&local_330 >> 0x28);
        f.this = (Coproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                  *)local_c0;
        f.f = (Preprocess *)local_1e0;
        Lib::CoproductImpl::
        RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>
        ::
        switchN<Lib::Coproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>::apply<Inferences::VariableMultiplicationGeneralizationImpl::Preprocess>(Inferences::VariableMultiplicationGeneralizationImpl::Preprocess)&::_lambda(auto:1)_1_>
                  ((RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>
                    *)local_c0,f);
        Lib::
        IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
        ::tryNext((Option<Kernel::AnyPoly> *)local_1e0,this);
        if (local_1e0[0] !=
            (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>,Inferences::__8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_>
             )0x1) break;
        uVar25 = (undefined7)((ulong)puVar23 >> 8);
        uVar21 = CONCAT53(local_1e0._16_5_,local_1e0._13_3_);
        local_c0[4] = local_1e0[8];
        local_c0._1_3_ = local_1e0._5_3_;
        OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
        ._content[4] = '\0';
        OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
        ._content[5] = '\0';
        OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._7_2_ = 0;
        OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._17_3_ = 0;
        OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
        ._content[0] = SUB81(local_1e0._0_8_,5);
        OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._2_2_ = SUB82(local_1e0._0_8_,6);
        OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
        ._content[3] = local_1e0[8];
        OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
        ._content[8] = (char)local_1e0._13_3_;
        OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._10_2_ = SUB32(local_1e0._13_3_,1);
        OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
        ._content[0xb] = (char)local_1e0._16_5_;
        OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._13_4_ = SUB54(local_1e0._16_5_,1);
      }
    }
    Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_2a0);
    local_2f8 = (SplitSet *)0x0;
    pSStack_2f0 = (SplitSet *)0x0;
    local_308 = (undefined1  [8])0x0;
    pAStack_300 = (AnyNumber<Kernel::MonomFactor> *)0x0;
    Lib::IntUnionFind::evalComponents(&local_128);
    piVar28 = (int *)CONCAT71(local_128._components._cursor._1_7_,
                              (char)local_128._components._cursor);
    if (piVar28 != local_128._components._stack) {
      do {
        iVar19 = Lib::IntUnionFind::root(&local_128,piVar28[-1]);
        pVVar6 = local_330._stack;
        lVar24 = (long)iVar19;
        puVar23 = (undefined1 *)(lVar24 * 9);
        if (((byte)*(RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>
                     *)((long)local_330._stack + lVar24 * 0x24) & 1) == 0) {
          pRVar33 = (RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>
                     *)((long)local_330._stack + lVar24 * 0x24 + 1);
          uVar21 = *(undefined8 *)((long)local_330._stack + lVar24 * 0x24 + 0x11);
          OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[3] = (char)uVar21;
          OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[4] = (char)((ulong)uVar21 >> 8);
          OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[5] = (char)((ulong)uVar21 >> 0x10);
          OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._7_2_ =
               (undefined2)((ulong)uVar21 >> 0x18);
          OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[8] = (char)((ulong)uVar21 >> 0x28);
          OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._10_2_ =
               (undefined2)((ulong)uVar21 >> 0x30);
          OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
          ._content[0xb] = (char)pRVar33;
          OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._13_4_ =
               (undefined4)((ulong)pRVar33 >> 8);
          OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._17_3_ =
               (undefined3)((ulong)pRVar33 >> 0x28);
          local_240._16_8_ = 0;
          VStack_228.init._iter._lit = (Literal *)0x0;
          local_240._0_8_ = 0;
          local_240._8_8_ = (int *)0x0;
          VStack_228._8_8_ = VStack_228._8_8_ & 0xffffffff00000000;
          local_2e8._18_4_ = (undefined4)((ulong)uVar21 >> 0x10);
          local_2e8[0x10] =
               OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper.
               _inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
               ._content[3];
          local_2e8[0x11] =
               OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper.
               _inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
               ._content[4];
          local_2e8._22_2_ = OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._10_2_;
          local_2e8[0x18] =
               OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper.
               _inner.
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
               .
               super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
               ._content[0xb];
          local_2e8._25_4_ = OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._13_4_;
          local_2e8._29_3_ = OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._17_3_;
          Lib::OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::OptionBase
                    (&local_2c8,(OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> *)local_240
                    );
          local_1e0._24_8_ = CONCAT35(local_2e8._29_3_,CONCAT41(local_2e8._25_4_,local_2e8[0x18]));
          puVar23 = local_1e0 + 8;
          uVar2 = CONCAT42(local_2e8._18_4_,CONCAT11(local_2e8[0x11],local_2e8[0x10]));
          local_1e0[8] = local_2e8[8];
          local_1e0._9_4_ =
               (undefined4)
               (CONCAT53(local_2e8._11_5_,
                         CONCAT12(local_2e8[10],CONCAT11(local_2e8[9],local_2e8[8]))) >> 8);
          local_1e0._13_3_ = SUB53(local_2e8._11_5_,2);
          local_1e0._16_5_ = (undefined5)uVar2;
          local_1e0._21_3_ = (undefined3)(CONCAT26(local_2e8._22_2_,uVar2) >> 0x28);
          Lib::OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::OptionBase
                    ((OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> *)(local_1e0 + 0x20),
                     &local_2c8);
          bVar18 = Lib::
                   FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>
                   ::hasNext((FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
                              *)local_1e0);
          if (bVar18) {
            Lib::
            FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>
            ::hasNext((FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
                       *)local_1e0);
            uVar26 = local_1bc._25_4_;
            uVar5 = local_1bc._0_1_;
            local_35c = '\0';
            local_340 = '\0';
            local_348 = '\0';
            uStack_347._0_1_ = 0;
            uStack_347._1_1_ = false;
            uStack_347._2_5_ = 0;
            bVar31 = local_1bc.init.
                     super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                     ._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     .
                     super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                     ._content[0] & 3;
            uVar29 = local_1bc._2_4_;
            if (bVar31 == 0) {
              local_360 = local_1bc._2_4_;
              local_348 = local_1bc.init.
                          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          ._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                          .
                          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          ._content[9];
              uStack_347 = local_1bc._11_7_;
            }
            else if (bVar31 == 1) {
              local_360 = local_1bc._2_4_;
            }
            else {
              local_360 = local_1bc._2_4_ & 0xffffff03;
              local_35c = local_1bc.init.
                          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          ._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                          .
                          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          ._content[5];
              uStack_347 = local_1bc._11_7_;
              local_340 = local_1bc.init.
                          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          ._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                          .
                          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          ._content[0x11];
              uVar29 = (uint)(local_1bc.init.
                              super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                              ._inner.
                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                              .
                              super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                              ._content[1] & 3);
            }
            local_2e8[0x10] = '\0';
            local_2e8[0x11] = '\0';
            local_2e8._18_4_ = 0;
            local_2e8._22_2_ = 0;
            local_2e8[0x18] = '\0';
            local_2e8._25_4_ = 0;
            local_2e8._29_3_ = 0;
            local_2e8[0] = (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>,Inferences::__8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_>
                            )0x0;
            local_2e8[1] = 0;
            local_2e8[2] = 0;
            local_2e8[3] = '\0';
            local_2e8._4_2_ = 0;
            local_2e8[6] = '\0';
            local_2e8[7] = '\0';
            local_2e8[8] = '\0';
            local_2e8[9] = '\0';
            local_2e8[10] = '\0';
            local_2e8._11_5_ = 0;
            local_2c8._0_4_ = 0;
            Lib::OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::operator=
                      ((OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> *)(local_1e0 + 0x20)
                       ,(OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> *)local_2e8);
            local_260[0] = uVar5 & 3;
            puVar23 = (undefined1 *)0x0;
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._17_3_ = 0;
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
            ._content[4] = '\0';
            uVar14 = OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.
                     super_AnyPolySuper._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                     ._content[4];
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
            ._content[5] = '\0';
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._10_2_ = 0;
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
            ._content[0xb] = '\0';
            local_260[6] = '\0';
            OStack_258.super_OptionBase<Kernel::AnyPoly>._2_1_ = '\0';
            OStack_258.super_OptionBase<Kernel::AnyPoly>._3_1_ = '\0';
            uVar5 = OStack_258.super_OptionBase<Kernel::AnyPoly>._3_1_;
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._0_1_ = 0;
            uVar10 = OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._0_1_;
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
            ._content[0] = '\0';
            uVar11 = OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.
                     super_AnyPolySuper._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                     ._content[0];
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._2_2_ = 0;
            uVar12 = OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._2_2_;
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
            ._content[3] = '\0';
            uVar13 = OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.
                     super_AnyPolySuper._inner.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
                     .
                     super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                     ._content[3];
            OStack_258.super_OptionBase<Kernel::AnyPoly>._3_1_ = SUB71(uStack_347,0);
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._0_1_ = SUB71(uStack_347,1);
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
            ._content[0] = SUB71(uStack_347,2);
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
            ._content[3] = SUB71(uStack_347,5);
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
            ._content[4] = SUB71(uStack_347,6);
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._2_2_ = SUB72(uStack_347,3);
            if (bVar31 == 0) {
              local_260._2_4_ = local_360;
              OStack_258.super_OptionBase<Kernel::AnyPoly>._2_1_ = local_348;
            }
            else if (bVar31 == 1) {
              local_260._2_4_ = local_360;
              OStack_258.super_OptionBase<Kernel::AnyPoly>._3_1_ = uVar5;
              OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._0_1_ = uVar10;
              OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper.
              _inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
              ._content[0] = uVar11;
              OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._2_2_ = uVar12;
              OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper.
              _inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
              ._content[3] = uVar13;
              OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper.
              _inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
              ._content[4] = uVar14;
            }
            else {
              OStack_258.super_OptionBase<Kernel::AnyPoly>._2_1_ = '\0';
              puVar23 = (undefined1 *)(ulong)CONCAT13(local_35c,local_360._1_3_);
              local_260._2_4_ = CONCAT31(local_360._1_3_,(char)uVar29) & 0xffffff03;
              local_260[6] = local_35c;
              OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper.
              _inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
              ._content[5] = local_340;
            }
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem.init.super_AnyPolySuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
            ._content[8] = '\0';
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._7_2_ = 0;
            OStack_258.super_OptionBase<Kernel::AnyPoly>._1_1_ = '\0';
            OStack_258.super_OptionBase<Kernel::AnyPoly>._isSome = false;
            local_260[7] = '\0';
            OStack_258.super_OptionBase<Kernel::AnyPoly>._elem._elem._13_4_ = uVar26;
            local_260[1] = bVar31;
            Lib::OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::OptionBase
                      ((OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> *)local_c0,
                       (AnyNumber<Kernel::MonomFactor> *)local_260);
            if (((byte)local_c0[0] & 1) != 0) {
              pbVar32 = *(byte **)((long)pVVar6 + lVar24 * 0x24 + 9);
              local_1e8 = *(byte **)((long)pVVar6 + lVar24 * 0x24 + 0x11);
              if (pbVar32 != local_1e8) {
                do {
                  local_2e8._29_3_ = 0;
                  local_2e8[0] = (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>,Inferences::__8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_>
                                  )(*pbVar32 & 3);
                  local_2e8[6] = '\0';
                  local_2e8[10] = '\0';
                  local_2e8._11_5_ = 0;
                  local_2e8[0x10] = '\0';
                  local_2e8[0x11] = '\0';
                  local_2e8._18_4_ = 0;
                  local_2e8._22_2_ = 0;
                  local_2e8[0x18] = '\0';
                  local_2e8[1] = pbVar32[1] & 3;
                  if (local_2e8[1] == 0) {
                    uVar26 = *(undefined4 *)(pbVar32 + 2);
                    local_2e8[2] = (byte)uVar26;
                    local_2e8[3] = (char)((uint)uVar26 >> 8);
                    local_2e8._4_2_ = (undefined2)((uint)uVar26 >> 0x10);
                    uVar21 = *(undefined8 *)(pbVar32 + 10);
                    local_2e8[10] = (undefined1)uVar21;
                    local_2e8._11_5_ = (undefined5)((ulong)uVar21 >> 8);
                    local_2e8[0x10] = (undefined1)((ulong)uVar21 >> 0x30);
                    local_2e8[0x11] = (undefined1)((ulong)uVar21 >> 0x38);
                  }
                  else if (local_2e8[1] == 1) {
                    uVar26 = *(undefined4 *)(pbVar32 + 2);
                    local_2e8[2] = (byte)uVar26;
                    local_2e8[3] = (char)((uint)uVar26 >> 8);
                    local_2e8._4_2_ = (undefined2)((uint)uVar26 >> 0x10);
                  }
                  else {
                    local_2e8[10] = '\0';
                    local_2e8[2] = pbVar32[2] & 3;
                    uVar21 = *(undefined8 *)(pbVar32 + 0xb);
                    uVar29 = *(uint *)(pbVar32 + 3);
                    puVar23 = (undefined1 *)(ulong)uVar29;
                    local_2e8[3] = (char)uVar29;
                    local_2e8._4_2_ = (undefined2)(uVar29 >> 8);
                    local_2e8[6] = (undefined1)(uVar29 >> 0x18);
                    local_2e8._11_5_ = (undefined5)uVar21;
                    local_2e8[0x10] = (undefined1)((ulong)uVar21 >> 0x28);
                    local_2e8[0x11] = (undefined1)((ulong)uVar21 >> 0x30);
                    local_2e8[0x12] = (undefined1)((ulong)uVar21 >> 0x38);
                    local_2e8._19_3_ = 0;
                  }
                  local_2e8[9] = '\0';
                  local_2e8[8] = '\0';
                  local_2e8[7] = '\0';
                  local_2e8._25_4_ = *(undefined4 *)(pbVar32 + 0x19);
                  bVar18 = Lib::operator==((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                            *)local_2e8,
                                           (Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                            *)(local_c0 + 4));
                  uVar26 = local_2e8._25_4_;
                  FVar9 = local_2e8[0];
                  if (!bVar18) {
                    local_364 = '\0';
                    local_350 = '\0';
                    local_358 = '\0';
                    uStack_357 = 0;
                    uVar5 = uStack_357;
                    uStack_356 = 0;
                    bVar31 = local_2e8[1] & 3;
                    uStack_357 = (undefined1)local_2e8._11_5_;
                    if (bVar31 == 0) {
                      uVar29 = CONCAT22(local_2e8._4_2_,CONCAT11(local_2e8[3],local_2e8[2]));
                      local_358 = local_2e8[10];
                      uStack_356 = (undefined6)
                                   (CONCAT17(local_2e8[0x11],
                                             CONCAT16(local_2e8[0x10],
                                                      CONCAT51(local_2e8._11_5_,local_2e8[10]))) >>
                                   0x10);
                      local_368 = uVar29;
                    }
                    else if (bVar31 == 1) {
                      uVar29 = CONCAT22(local_2e8._4_2_,CONCAT11(local_2e8[3],local_2e8[2]));
                      local_368 = uVar29;
                      uStack_357 = uVar5;
                    }
                    else {
                      local_358 = '\0';
                      uVar29 = (uint)(local_2e8[2] & 3);
                      local_368 = CONCAT31(CONCAT21(local_2e8._4_2_,local_2e8[3]),local_2e8[2]) &
                                  0xffffff03;
                      local_364 = local_2e8[6];
                      uStack_356 = (undefined6)
                                   (CONCAT16(local_2e8[0x11],
                                             CONCAT15(local_2e8[0x10],local_2e8._11_5_)) >> 8);
                      local_350 = local_2e8[0x12];
                    }
                    if (local_2f8 == pSStack_2f0) {
                      Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::expand
                                ((Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)local_308);
                    }
                    *(undefined8 *)local_2f8[1]._items = 0;
                    *(byte *)&(((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                 *)&local_2f8->_size)->_inner).
                              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                              .
                              super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                         = (byte)FVar9 & 3;
                    pRVar3 = &((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                *)&local_2f8->_size)->_inner;
                    (pRVar3->
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    ).
                    super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    ._content[0] = '\0';
                    (pRVar3->
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    ).
                    super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    ._content[1] = '\0';
                    (pRVar3->
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    ).
                    super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    ._content[2] = '\0';
                    (pRVar3->
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    ).
                    super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    ._content[3] = '\0';
                    (pRVar3->
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    ).
                    super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    ._content[4] = '\0';
                    (pRVar3->
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    ).
                    super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    ._content[5] = '\0';
                    (pRVar3->
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    ).
                    super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    ._content[6] = '\0';
                    (pRVar3->
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    ).
                    super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    ._content[7] = '\0';
                    pcVar1 = (char *)((long)local_2f8->_items + 1);
                    pcVar1[0] = '\0';
                    pcVar1[1] = '\0';
                    pcVar1[2] = '\0';
                    pcVar1[3] = '\0';
                    pcVar1[4] = '\0';
                    pcVar1[5] = '\0';
                    pcVar1[6] = '\0';
                    pcVar1[7] = '\0';
                    pcVar1 = (char *)((long)&local_2f8[1]._size + 1);
                    pcVar1[0] = '\0';
                    pcVar1[1] = '\0';
                    pcVar1[2] = '\0';
                    pcVar1[3] = '\0';
                    pcVar1[4] = '\0';
                    pcVar1[5] = '\0';
                    pcVar1[6] = '\0';
                    pcVar1[7] = '\0';
                    (((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                       *)&local_2f8->_size)->_inner).
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    .
                    super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    ._content[0] = bVar31;
                    if (bVar31 == 0) {
                      *(uint *)((((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                   *)&local_2f8->_size)->_inner).
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                .
                                super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                ._content + 1) = local_368;
                      puVar23 = (undefined1 *)CONCAT62(uStack_356,CONCAT11(uStack_357,local_358));
                      *(undefined1 **)((long)local_2f8->_items + 2) = puVar23;
                    }
                    else if (bVar31 == 1) {
                      puVar23 = (undefined1 *)(ulong)local_368;
                      *(uint *)((((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                   *)&local_2f8->_size)->_inner).
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                .
                                super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                ._content + 1) = local_368;
                    }
                    else {
                      pDVar4 = &(((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                   *)&local_2f8->_size)->_inner).
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      ;
                      (pDVar4->
                      super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      )._content[5] = '\0';
                      (pDVar4->
                      super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      )._content[6] = '\0';
                      (pDVar4->
                      super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      )._content[7] = '\0';
                      (pDVar4->
                      super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      )._content[8] = '\0';
                      (pDVar4->
                      super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      )._content[9] = '\0';
                      (pDVar4->
                      super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      )._content[10] = '\0';
                      (pDVar4->
                      super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      )._content[0xb] = '\0';
                      (pDVar4->
                      super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      )._content[0xc] = '\0';
                      *(undefined8 *)&local_2f8->field_0xe = 0;
                      (((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                         *)&local_2f8->_size)->_inner).
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      .
                      super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      ._content[1] = (byte)uVar29 & 3;
                      puVar23 = (undefined1 *)CONCAT17(local_350,CONCAT61(uStack_356,uStack_357));
                      *(uint *)((((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                   *)&local_2f8->_size)->_inner).
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                .
                                super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                ._content + 2) = CONCAT13(local_364,local_368._1_3_);
                      *(undefined1 **)((long)local_2f8->_items + 3) = puVar23;
                    }
                    *(undefined4 *)((long)local_2f8[1]._items + 1) = uVar26;
                    local_2f8 = local_2f8 + 2;
                  }
                  pbVar32 = pbVar32 + 0x20;
                } while (pbVar32 != local_1e8);
              }
            }
          }
        }
        piVar28 = piVar28 + -1;
      } while (piVar28 != local_128._components._stack);
    }
    pSVar8 = local_2f8;
    pAVar7 = pAStack_300;
    if ((long)local_2f8 - (long)pAStack_300 == 0) {
      uVar26 = 0;
    }
    else {
      uVar22 = (long)local_2f8 - (long)pAStack_300 >> 5;
      lVar24 = 0x3f;
      if (uVar22 != 0) {
        for (; uVar22 >> lVar24 == 0; lVar24 = lVar24 + -1) {
        }
      }
      std::
      __introsort_loop<Inferences::AnyNumber<Kernel::MonomFactor>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pAStack_300,local_2f8,((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<Inferences::AnyNumber<Kernel::MonomFactor>*,__gnu_cxx::__ops::_Iter_less_iter>
                (pAVar7,pSVar8);
      eval.eval.toRem = (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)(ulong)(byte)local_30c
      ;
      eval.eval._8_8_ = puVar23;
      RVar34 = generalizeBottomUp<Inferences::EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize>>
                         ((Inferences *)cl,(Clause *)local_308,eval);
      local_338 = RVar34.simplified;
      uVar26 = RVar34._8_4_;
    }
    pRVar33 = (RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>
               *)local_330._cursor;
    if (pAStack_300 != (AnyNumber<Kernel::MonomFactor> *)0x0) {
      uVar22 = (long)local_308 << 5;
      if (uVar22 == 0) {
        *(undefined8 *)
         &(pAStack_300->
          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          )._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          .
          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pAStack_300;
      }
      else if (uVar22 < 0x21) {
        *(undefined8 *)
         &(pAStack_300->
          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          )._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          .
          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pAStack_300;
      }
      else if (uVar22 < 0x31) {
        *(undefined8 *)
         &(pAStack_300->
          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          )._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          .
          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pAStack_300;
      }
      else if (uVar22 < 0x41) {
        *(undefined8 *)
         &(pAStack_300->
          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          )._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          .
          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pAStack_300;
      }
      else {
        operator_delete(pAStack_300,0x10);
        pRVar33 = (RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>
                   *)local_330._cursor;
      }
    }
    while (pRVar33 !=
           (RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top> *)
           local_330._stack) {
      pRVar33 = pRVar33 + -0x24;
      Lib::CoproductImpl::
      RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>::
      switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top>>::~DefaultImpl()::_lambda(auto:1)_1_>
                (pRVar33,(anon_class_8_1_8991fb9c)pRVar33);
    }
    if (pRVar33 !=
        (RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>,Inferences::Top> *)0x0)
    {
      uVar22 = local_330._capacity * 0x24 + 0xf & 0xfffffffffffffff0;
      if (uVar22 == 0) {
        *(undefined8 *)local_330._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_330._stack;
      }
      else if (uVar22 < 0x11) {
        *(undefined8 *)local_330._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_330._stack;
      }
      else if (uVar22 < 0x19) {
        *(undefined8 *)local_330._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_330._stack;
      }
      else if (uVar22 < 0x21) {
        *(undefined8 *)local_330._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_330._stack;
      }
      else if (uVar22 < 0x31) {
        *(undefined8 *)local_330._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_330._stack;
      }
      else if (uVar22 < 0x41) {
        *(undefined8 *)local_330._stack = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_330._stack;
      }
      else {
        operator_delete(local_330._stack,0x10);
      }
    }
    Lib::IntUnionFind::~IntUnionFind(&local_128);
  }
  if (puStack_140 != (undefined8 *)0x0) {
    uVar22 = local_148 * 4 + 0xfU & 0xfffffffffffffff0;
    if (uVar22 == 0) {
      *puStack_140 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puStack_140;
    }
    else if (uVar22 < 0x11) {
      *puStack_140 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puStack_140;
    }
    else if (uVar22 < 0x19) {
      *puStack_140 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puStack_140;
    }
    else if (uVar22 < 0x21) {
      *puStack_140 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puStack_140;
    }
    else if (uVar22 < 0x31) {
      *puStack_140 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puStack_140;
    }
    else if (uVar22 < 0x41) {
      *puStack_140 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puStack_140;
    }
    else {
      operator_delete(puStack_140,0x10);
    }
  }
  Lib::Map<Kernel::Variable,_unsigned_int,_Lib::StlHash>::clear(&local_168);
  RVar34._8_4_ = uVar26;
  RVar34.simplified = local_338;
  RVar34._12_4_ = 0;
  return RVar34;
}

Assistant:

SimplifyingGeneratingInference1::Result applyRule(Clause* cl, bool doOrderingCheck) 
{
  DEBUG("input clause: ", *cl);
  IntMap<Variable> varMap;

  /* initialization */
  for (auto var : iterVars(cl)) {
    varMap.insert(var);
  }
  if (varMap.size() == 0) {
    DEBUG("no variables. generalization not applicable");
    return SimplifyingGeneratingInference1::Result::nop(cl);
  }

  IntUnionFind components(varMap.size());
  Stack<VariableRegion> varRegions(varMap.size());;
  for (unsigned i = 0; i < varMap.size(); i++)  {
    varRegions.push(VariableRegion());
  }

  /* preprocessing. finds all products `X0 ⋅ X1 ⋅ ... ⋅ Xn` such that the rule is applicable */
  for (auto poly : iterPolynoms(cl)) {
    poly.apply(Preprocess {components, varMap, varRegions});
  }


  /* create a stack of all variables that shall be removed in the final step */

  Stack<AnyNumber<MonomFactor>> remove;

  components.evalComponents();
  for (auto comp : iterTraits(IntUnionFind::ComponentIterator(components))) {
    auto& maybeRegion = varRegions[components.root(comp.next())];
    if (maybeRegion.isInit()) {
      auto& region = maybeRegion.unwrap();

      /* one variable with power one needs to be kept, per varible region */
      auto var = iterTraits(region.iter())
        .map([](auto& x) { return x; })
        .filter([](auto& p) { return p.apply([](auto& t){ return t.tryVar(); }).isSome(); })
        .tryNext();

      if (var.isSome()) {
        for (auto varPower : region) {
          if (varPower != var.unwrap()) {
            remove.push(varPower);
          }
        }
      }
    }
  }

  /* apply the substitution `X0 ⋅ X1 ⋅ ... ⋅ Xn ==> X0`  */
  DEBUG("removing variables: ", remove)
  if (remove.isEmpty()) {
    return SimplifyingGeneratingInference1::Result::nop(cl);
  } else {
    std::sort(remove.begin(), remove.end());
    Generalize gen { remove, doOrderingCheck };
    return generalizeBottomUp(cl, EvaluateMonom<Generalize> {gen});
  }
}